

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::RemoveFlowEdgeToCatchBlock(GlobOpt *this,Instr *instr)

{
  BasicBlock *succBlock;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BranchInstr *pBVar4;
  Instr *pIVar5;
  LabelInstr *pLVar6;
  FlowEdge *pFVar7;
  BasicBlock *predBlock;
  
  if (instr->m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fd1,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
    if (!bVar2) goto LAB_00441758;
    *puVar3 = 0;
  }
  if (instr->m_opcode == BrOnNoException) {
LAB_004414cf:
    pIVar5 = IR::Instr::GetNextRealInstrOrLabel(instr);
    if ((pIVar5->m_kind != InstrKindLabel) && (pIVar5->m_kind != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fde,"(nextInstr->IsLabelInstr())","nextInstr->IsLabelInstr()");
      if (!bVar2) goto LAB_00441758;
      *puVar3 = 0;
    }
    pLVar6 = IR::Instr::AsLabelInstr(pIVar5);
    if ((pLVar6->m_region != (Region *)0x0) && (pLVar6->m_region->type == RegionTypeCatch))
    goto LAB_0044155d;
    pIVar5 = (pLVar6->super_Instr).m_next;
    if (pIVar5->m_kind == InstrKindBranch) {
      pBVar4 = IR::Instr::AsBranchInstr(pIVar5);
      bVar2 = IR::BranchInstr::IsUnconditional(pBVar4);
      if (!bVar2) goto LAB_00441584;
    }
    else {
LAB_00441584:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fe8,
                         "(nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional())"
                         ,
                         "nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional()"
                        );
      if (!bVar2) goto LAB_00441758;
      *puVar3 = 0;
    }
    predBlock = pLVar6->m_block;
    pBVar4 = IR::Instr::AsBranchInstr((pLVar6->super_Instr).m_next);
    pLVar6 = pBVar4->m_branchTarget;
    if (pLVar6->m_region->type != RegionTypeCatch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fec,"(catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch)",
                         "catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch");
      if (!bVar2) goto LAB_00441758;
      *puVar3 = 0;
    }
  }
  else {
    if (instr->m_opcode != BrOnException) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3fdc,"(instr->m_opcode == Js::OpCode::BrOnNoException)",
                         "instr->m_opcode == Js::OpCode::BrOnNoException");
      if (!bVar2) goto LAB_00441758;
      *puVar3 = 0;
      goto LAB_004414cf;
    }
    pBVar4 = IR::Instr::AsBranchInstr(instr);
    pLVar6 = pBVar4->m_branchTarget;
LAB_0044155d:
    predBlock = this->currentBlock;
  }
  succBlock = pLVar6->m_block;
  if (succBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3ff2,"(catchBlock)","catchBlock");
    if (!bVar2) goto LAB_00441758;
    *puVar3 = 0;
  }
  if (predBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3ff3,"(predBlock)","predBlock");
    if (!bVar2) {
LAB_00441758:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pFVar7 = FlowGraph::FindEdge(this->func->m_fg,predBlock,succBlock);
  if ((pFVar7 != (FlowEdge *)0x0) &&
     (BasicBlock::RemoveDeadSucc(predBlock,succBlock,this->func->m_fg),
     predBlock == this->currentBlock)) {
    BasicBlock::DecrementDataUseCount(predBlock);
    return;
  }
  return;
}

Assistant:

void
GlobOpt::RemoveFlowEdgeToCatchBlock(IR::Instr * instr)
{
    Assert(instr->IsBranchInstr());

    BasicBlock * catchBlock = nullptr;
    BasicBlock * predBlock = nullptr;
    if (instr->m_opcode == Js::OpCode::BrOnException)
    {
        catchBlock = instr->AsBranchInstr()->GetTarget()->GetBasicBlock();
        predBlock = this->currentBlock;
    }
    else
    {
        Assert(instr->m_opcode == Js::OpCode::BrOnNoException);
        IR::Instr * nextInstr = instr->GetNextRealInstrOrLabel();
        Assert(nextInstr->IsLabelInstr());
        IR::LabelInstr * nextLabel = nextInstr->AsLabelInstr();

        if (nextLabel->GetRegion() && nextLabel->GetRegion()->GetType() == RegionTypeCatch)
        {
            catchBlock = nextLabel->GetBasicBlock();
            predBlock = this->currentBlock;
        }
        else
        {
            Assert(nextLabel->m_next->IsBranchInstr() && nextLabel->m_next->AsBranchInstr()->IsUnconditional());
            BasicBlock * nextBlock = nextLabel->GetBasicBlock();
            IR::BranchInstr * branchToCatchBlock = nextLabel->m_next->AsBranchInstr();
            IR::LabelInstr * catchBlockLabel = branchToCatchBlock->GetTarget();
            Assert(catchBlockLabel->GetRegion()->GetType() == RegionTypeCatch);
            catchBlock = catchBlockLabel->GetBasicBlock();
            predBlock = nextBlock;
        }
    }

    Assert(catchBlock);
    Assert(predBlock);
    if (this->func->m_fg->FindEdge(predBlock, catchBlock))
    {
        predBlock->RemoveDeadSucc(catchBlock, this->func->m_fg);
        if (predBlock == this->currentBlock)
        {
            predBlock->DecrementDataUseCount();
        }
    }
}